

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  RTCRayQueryContext *pRVar5;
  undefined8 uVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  RayQueryContext *pRVar19;
  RayQueryContext *pRVar20;
  byte bVar22;
  int iVar23;
  long lVar24;
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  RTCRayQueryContext *pRVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  float fVar33;
  uint uVar34;
  float fVar44;
  float fVar46;
  vint4 bi;
  uint uVar45;
  uint uVar47;
  float fVar48;
  uint uVar49;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar43;
  int iVar50;
  int iVar55;
  int iVar56;
  vint4 bi_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar57;
  float fVar58;
  float fVar66;
  float fVar68;
  vint4 ai;
  uint uVar59;
  uint uVar67;
  uint uVar69;
  float fVar70;
  uint uVar71;
  StackItemT<embree::NodeRefPtr<4>_> SVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar74;
  float fVar75;
  vint4 ai_1;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar79;
  float fVar82;
  float fVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar89;
  float fVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar91;
  float fVar92;
  float fVar96;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  int iVar127;
  float fVar128;
  int iVar129;
  float fVar130;
  int iVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined8 local_11f8;
  vbool<4> valid;
  undefined1 local_11a8 [16];
  long local_1198;
  long local_1190;
  long local_1188;
  undefined1 (*local_1180) [16];
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_10e8 [4];
  float local_10d8 [4];
  float local_10c8 [4];
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8 [16];
  float local_1098 [4];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar21;
  undefined1 auVar95 [16];
  
  pRVar19 = (RayQueryContext *)(stack + 1);
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar84 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar104 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar92 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar96 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar91 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar16 = (tray->tnear).field_0.i[k];
  iVar57 = (tray->tfar).field_0.i[k];
  local_1180 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1018 = fVar84;
  fStack_1014 = fVar84;
  fStack_1010 = fVar84;
  fStack_100c = fVar84;
  local_1028 = fVar104;
  fStack_1024 = fVar104;
  fStack_1020 = fVar104;
  fStack_101c = fVar104;
  local_1038 = fVar92;
  fStack_1034 = fVar92;
  fStack_1030 = fVar92;
  fStack_102c = fVar92;
  local_1048 = fVar96;
  fStack_1044 = fVar96;
  fStack_1040 = fVar96;
  fStack_103c = fVar96;
  local_1058 = fVar91;
  fStack_1054 = fVar91;
  fStack_1050 = fVar91;
  fStack_104c = fVar91;
  local_1068 = fVar106;
  fStack_1064 = fVar106;
  fStack_1060 = fVar106;
  fStack_105c = fVar106;
  local_1078 = iVar16;
  iStack_1074 = iVar16;
  iStack_1070 = iVar16;
  iStack_106c = iVar16;
  iVar56 = iVar57;
  iVar55 = iVar57;
  iVar50 = iVar57;
  iVar131 = iVar16;
  iVar129 = iVar16;
  iVar127 = iVar16;
  fVar125 = fVar106;
  fVar124 = fVar106;
  fVar123 = fVar106;
  fVar121 = fVar91;
  fVar119 = fVar91;
  fVar117 = fVar91;
  fVar115 = fVar96;
  fVar114 = fVar96;
  fVar113 = fVar96;
  fVar78 = fVar92;
  fVar76 = fVar92;
  fVar74 = fVar92;
  fVar100 = fVar104;
  fVar99 = fVar104;
  fVar98 = fVar104;
  fVar112 = fVar84;
  fVar110 = fVar84;
  fVar108 = fVar84;
LAB_0024a214:
  do {
    pRVar20 = pRVar19 + -1;
    pRVar19 = (RayQueryContext *)&pRVar19[-1].user;
    if (*(float *)&pRVar20->args < *(float *)(ray + k * 4 + 0x80) ||
        *(float *)&pRVar20->args == *(float *)(ray + k * 4 + 0x80)) {
      pRVar25 = *(RTCRayQueryContext **)pRVar19;
      while (((ulong)pRVar25 & 8) == 0) {
        pfVar4 = (float *)((long)pRVar25[4].instID + uVar27);
        fVar33 = (*pfVar4 - fVar108) * fVar113;
        fVar44 = (pfVar4[1] - fVar110) * fVar114;
        fVar46 = (pfVar4[2] - fVar112) * fVar115;
        fVar48 = (pfVar4[3] - fVar84) * fVar96;
        pfVar4 = (float *)((long)pRVar25[4].instID + uVar29);
        fVar58 = (*pfVar4 - fVar98) * fVar117;
        fVar66 = (pfVar4[1] - fVar99) * fVar119;
        fVar68 = (pfVar4[2] - fVar100) * fVar121;
        fVar70 = (pfVar4[3] - fVar104) * fVar91;
        uVar59 = (uint)((int)fVar58 < (int)fVar33) * (int)fVar33 |
                 (uint)((int)fVar58 >= (int)fVar33) * (int)fVar58;
        uVar67 = (uint)((int)fVar66 < (int)fVar44) * (int)fVar44 |
                 (uint)((int)fVar66 >= (int)fVar44) * (int)fVar66;
        uVar69 = (uint)((int)fVar68 < (int)fVar46) * (int)fVar46 |
                 (uint)((int)fVar68 >= (int)fVar46) * (int)fVar68;
        uVar71 = (uint)((int)fVar70 < (int)fVar48) * (int)fVar48 |
                 (uint)((int)fVar70 >= (int)fVar48) * (int)fVar70;
        pfVar4 = (float *)((long)pRVar25[4].instID + uVar32);
        fVar33 = (*pfVar4 - fVar74) * fVar123;
        fVar44 = (pfVar4[1] - fVar76) * fVar124;
        fVar46 = (pfVar4[2] - fVar78) * fVar125;
        fVar48 = (pfVar4[3] - fVar92) * fVar106;
        uVar34 = (uint)((int)fVar33 < iVar127) * iVar127 |
                 (uint)((int)fVar33 >= iVar127) * (int)fVar33;
        uVar45 = (uint)((int)fVar44 < iVar129) * iVar129 |
                 (uint)((int)fVar44 >= iVar129) * (int)fVar44;
        uVar47 = (uint)((int)fVar46 < iVar131) * iVar131 |
                 (uint)((int)fVar46 >= iVar131) * (int)fVar46;
        uVar49 = (uint)((int)fVar48 < iVar16) * iVar16 | (uint)((int)fVar48 >= iVar16) * (int)fVar48
        ;
        tNear.field_0.i[0] =
             ((int)uVar34 < (int)uVar59) * uVar59 | ((int)uVar34 >= (int)uVar59) * uVar34;
        tNear.field_0.i[1] =
             ((int)uVar45 < (int)uVar67) * uVar67 | ((int)uVar45 >= (int)uVar67) * uVar45;
        tNear.field_0.i[2] =
             ((int)uVar47 < (int)uVar69) * uVar69 | ((int)uVar47 >= (int)uVar69) * uVar47;
        tNear.field_0.i[3] =
             ((int)uVar49 < (int)uVar71) * uVar71 | ((int)uVar49 >= (int)uVar71) * uVar49;
        pfVar4 = (float *)((long)pRVar25[4].instID + (uVar27 ^ 0x10));
        fVar33 = (*pfVar4 - fVar108) * fVar113;
        fVar44 = (pfVar4[1] - fVar110) * fVar114;
        fVar46 = (pfVar4[2] - fVar112) * fVar115;
        fVar48 = (pfVar4[3] - fVar84) * fVar96;
        pfVar4 = (float *)((long)pRVar25[4].instID + (uVar29 ^ 0x10));
        fVar58 = (*pfVar4 - fVar98) * fVar117;
        fVar66 = (pfVar4[1] - fVar99) * fVar119;
        fVar68 = (pfVar4[2] - fVar100) * fVar121;
        fVar70 = (pfVar4[3] - fVar104) * fVar91;
        uVar59 = (uint)((int)fVar33 < (int)fVar58) * (int)fVar33 |
                 (uint)((int)fVar33 >= (int)fVar58) * (int)fVar58;
        uVar67 = (uint)((int)fVar44 < (int)fVar66) * (int)fVar44 |
                 (uint)((int)fVar44 >= (int)fVar66) * (int)fVar66;
        uVar69 = (uint)((int)fVar46 < (int)fVar68) * (int)fVar46 |
                 (uint)((int)fVar46 >= (int)fVar68) * (int)fVar68;
        uVar71 = (uint)((int)fVar48 < (int)fVar70) * (int)fVar48 |
                 (uint)((int)fVar48 >= (int)fVar70) * (int)fVar70;
        pfVar4 = (float *)((long)pRVar25[4].instID + (uVar32 ^ 0x10));
        fVar33 = (*pfVar4 - fVar74) * fVar123;
        fVar44 = (pfVar4[1] - fVar76) * fVar124;
        fVar46 = (pfVar4[2] - fVar78) * fVar125;
        fVar48 = (pfVar4[3] - fVar92) * fVar106;
        uVar34 = (uint)(iVar50 < (int)fVar33) * iVar50 | (uint)(iVar50 >= (int)fVar33) * (int)fVar33
        ;
        uVar45 = (uint)(iVar55 < (int)fVar44) * iVar55 | (uint)(iVar55 >= (int)fVar44) * (int)fVar44
        ;
        uVar47 = (uint)(iVar56 < (int)fVar46) * iVar56 | (uint)(iVar56 >= (int)fVar46) * (int)fVar46
        ;
        uVar49 = (uint)(iVar57 < (int)fVar48) * iVar57 | (uint)(iVar57 >= (int)fVar48) * (int)fVar48
        ;
        auVar61._0_4_ =
             -(uint)((int)(((int)uVar59 < (int)uVar34) * uVar59 |
                          ((int)uVar59 >= (int)uVar34) * uVar34) < tNear.field_0.i[0]);
        auVar61._4_4_ =
             -(uint)((int)(((int)uVar67 < (int)uVar45) * uVar67 |
                          ((int)uVar67 >= (int)uVar45) * uVar45) < tNear.field_0.i[1]);
        auVar61._8_4_ =
             -(uint)((int)(((int)uVar69 < (int)uVar47) * uVar69 |
                          ((int)uVar69 >= (int)uVar47) * uVar47) < tNear.field_0.i[2]);
        auVar61._12_4_ =
             -(uint)((int)(((int)uVar71 < (int)uVar49) * uVar71 |
                          ((int)uVar71 >= (int)uVar49) * uVar49) < tNear.field_0.i[3]);
        iVar23 = movmskps((int)root.ptr,auVar61);
        if (iVar23 == 0xf) {
          root.ptr = (size_t)stack;
          if (pRVar19 == (RayQueryContext *)root.ptr) {
            return;
          }
          goto LAB_0024a214;
        }
        bVar22 = (byte)iVar23 ^ 0xf;
        uVar30 = (ulong)pRVar25 & 0xfffffffffffffff0;
        root.ptr = 0;
        if (bVar22 != 0) {
          for (; (bVar22 >> root.ptr & 1) == 0;
              root.ptr = (long)&((NodeRefPtr<4> *)&((RayQueryContext *)root.ptr)->scene)->ptr + 1) {
          }
        }
        pRVar25 = *(RTCRayQueryContext **)(uVar30 + root.ptr * 8);
        uVar34 = bVar22 - 1 & (uint)bVar22;
        if (uVar34 != 0) {
          uVar45 = tNear.field_0.i[root.ptr];
          lVar26 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
            }
          }
          pRVar5 = *(RTCRayQueryContext **)(uVar30 + lVar26 * 8);
          uVar47 = tNear.field_0.i[lVar26];
          uVar34 = uVar34 - 1 & uVar34;
          root.ptr = (size_t)uVar34;
          if (uVar34 == 0) {
            if (uVar45 < uVar47) {
              ((NodeRefPtr<4> *)&pRVar19->scene)->ptr = (size_t)pRVar5;
              *(uint *)&pRVar19->user = uVar47;
              pRVar19 = (RayQueryContext *)&pRVar19->args;
            }
            else {
              ((NodeRefPtr<4> *)&pRVar19->scene)->ptr = (size_t)pRVar25;
              *(uint *)&pRVar19->user = uVar45;
              pRVar19 = (RayQueryContext *)&pRVar19->args;
              pRVar25 = pRVar5;
            }
          }
          else {
            auVar62._8_4_ = uVar45;
            auVar62._0_8_ = pRVar25;
            auVar62._12_4_ = 0;
            auVar81._8_4_ = uVar47;
            auVar81._0_8_ = pRVar5;
            auVar81._12_4_ = 0;
            lVar26 = 0;
            if ((RayQueryContext *)root.ptr != (RayQueryContext *)0x0) {
              for (; (uVar34 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
              }
            }
            uVar6 = *(undefined8 *)(uVar30 + lVar26 * 8);
            iVar23 = tNear.field_0.i[lVar26];
            auVar94._8_4_ = iVar23;
            auVar94._0_8_ = uVar6;
            auVar94._12_4_ = 0;
            auVar88._8_4_ = -(uint)((int)uVar45 < (int)uVar47);
            uVar34 = uVar34 - 1 & uVar34;
            if (uVar34 == 0) {
              auVar88._4_4_ = auVar88._8_4_;
              auVar88._0_4_ = auVar88._8_4_;
              auVar88._12_4_ = auVar88._8_4_;
              auVar86._8_4_ = uVar47;
              auVar86._0_8_ = pRVar5;
              auVar86._12_4_ = 0;
              auVar87 = blendvps(auVar86,auVar62,auVar88);
              auVar61 = blendvps(auVar62,auVar81,auVar88);
              auVar35._8_4_ = -(uint)(auVar87._8_4_ < iVar23);
              auVar35._4_4_ = auVar35._8_4_;
              auVar35._0_4_ = auVar35._8_4_;
              auVar35._12_4_ = auVar35._8_4_;
              auVar80._8_4_ = iVar23;
              auVar80._0_8_ = uVar6;
              auVar80._12_4_ = 0;
              auVar81 = blendvps(auVar80,auVar87,auVar35);
              auVar88 = blendvps(auVar87,auVar94,auVar35);
              auVar36._8_4_ = -(uint)(auVar61._8_4_ < auVar88._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              auVar62 = blendvps(auVar88,auVar61,auVar36);
              SVar60 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar61,auVar88,auVar36);
              *(StackItemT<embree::NodeRefPtr<4>_> *)pRVar19 = SVar60;
              *(undefined1 (*) [16])&pRVar19->args = auVar62;
              pRVar25 = auVar81._0_8_;
              pRVar19 = (RayQueryContext *)&pRVar19[1].user;
            }
            else {
              root.ptr = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> root.ptr & 1) == 0;
                    root.ptr = (long)&((NodeRefPtr<4> *)&((RayQueryContext *)root.ptr)->scene)->ptr
                               + 1) {
                }
              }
              auVar87._4_4_ = auVar88._8_4_;
              auVar87._0_4_ = auVar88._8_4_;
              auVar87._8_4_ = auVar88._8_4_;
              auVar87._12_4_ = auVar88._8_4_;
              auVar88 = blendvps(auVar81,auVar62,auVar87);
              auVar61 = blendvps(auVar62,auVar81,auVar87);
              auVar93._8_4_ = tNear.field_0.i[root.ptr];
              auVar93._0_8_ = *(undefined8 *)(uVar30 + root.ptr * 8);
              auVar93._12_4_ = 0;
              auVar37._8_4_ = -(uint)(iVar23 < tNear.field_0.i[root.ptr]);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              auVar81 = blendvps(auVar93,auVar94,auVar37);
              auVar62 = blendvps(auVar94,auVar93,auVar37);
              auVar38._8_4_ = -(uint)(auVar61._8_4_ < auVar62._8_4_);
              auVar38._4_4_ = auVar38._8_4_;
              auVar38._0_4_ = auVar38._8_4_;
              auVar38._12_4_ = auVar38._8_4_;
              auVar94 = blendvps(auVar62,auVar61,auVar38);
              SVar60 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar61,auVar62,auVar38);
              auVar39._8_4_ = -(uint)(auVar88._8_4_ < auVar81._8_4_);
              auVar39._4_4_ = auVar39._8_4_;
              auVar39._0_4_ = auVar39._8_4_;
              auVar39._12_4_ = auVar39._8_4_;
              auVar61 = blendvps(auVar81,auVar88,auVar39);
              auVar81 = blendvps(auVar88,auVar81,auVar39);
              auVar40._8_4_ = -(uint)(auVar81._8_4_ < auVar94._8_4_);
              auVar40._4_4_ = auVar40._8_4_;
              auVar40._0_4_ = auVar40._8_4_;
              auVar40._12_4_ = auVar40._8_4_;
              auVar62 = blendvps(auVar94,auVar81,auVar40);
              auVar81 = blendvps(auVar81,auVar94,auVar40);
              *(StackItemT<embree::NodeRefPtr<4>_> *)pRVar19 = SVar60;
              *(undefined1 (*) [16])&pRVar19->args = auVar81;
              pRVar19[1].user = (RTCRayQueryContext *)auVar62._0_8_;
              pRVar19[1].args = (RTCIntersectArguments *)auVar62._8_8_;
              pRVar25 = auVar61._0_8_;
              pRVar19 = pRVar19 + 2;
            }
          }
        }
      }
      lVar26 = (ulong)((uint)pRVar25 & 0xf) - 8;
      if (lVar26 != 0) {
        uVar30 = (ulong)pRVar25 & 0xfffffffffffffff0;
        lVar28 = 0;
        pRVar20 = pRVar19;
        do {
          lVar31 = lVar28 * 0xb0;
          pfVar4 = (float *)(uVar30 + 0x80 + lVar31);
          fVar108 = *pfVar4;
          fVar110 = pfVar4[1];
          fVar112 = pfVar4[2];
          fVar98 = pfVar4[3];
          pfVar4 = (float *)(uVar30 + 0x40 + lVar31);
          fVar99 = *pfVar4;
          fVar100 = pfVar4[1];
          fVar74 = pfVar4[2];
          fVar76 = pfVar4[3];
          pfVar4 = (float *)(uVar30 + 0x70 + lVar31);
          fVar78 = *pfVar4;
          fVar113 = pfVar4[1];
          fVar114 = pfVar4[2];
          fVar115 = pfVar4[3];
          pfVar4 = (float *)(uVar30 + 0x50 + lVar31);
          fVar117 = *pfVar4;
          fVar119 = pfVar4[1];
          fVar121 = pfVar4[2];
          fVar123 = pfVar4[3];
          fVar68 = fVar78 * fVar117 - fVar108 * fVar99;
          fVar70 = fVar113 * fVar119 - fVar110 * fVar100;
          fVar75 = fVar114 * fVar121 - fVar112 * fVar74;
          fVar77 = fVar115 * fVar123 - fVar98 * fVar76;
          pfVar4 = (float *)(uVar30 + 0x60 + lVar31);
          fVar124 = *pfVar4;
          fVar125 = pfVar4[1];
          fVar33 = pfVar4[2];
          fVar44 = pfVar4[3];
          pfVar4 = (float *)(uVar30 + lVar31);
          pfVar1 = (float *)(uVar30 + 0x10 + lVar31);
          pfVar2 = (float *)(uVar30 + 0x20 + lVar31);
          pfVar3 = (float *)(uVar30 + 0x30 + lVar31);
          fVar46 = *pfVar3;
          fVar48 = pfVar3[1];
          fVar58 = pfVar3[2];
          fVar66 = pfVar3[3];
          local_10a8._0_4_ = fVar108 * fVar46 - fVar117 * fVar124;
          local_10a8._4_4_ = fVar110 * fVar48 - fVar119 * fVar125;
          local_10a8._8_4_ = fVar112 * fVar58 - fVar121 * fVar33;
          local_10a8._12_4_ = fVar98 * fVar66 - fVar123 * fVar44;
          fVar84 = *(float *)(ray + k * 4);
          fVar104 = *(float *)(ray + k * 4 + 0x20);
          fVar92 = *(float *)(ray + k * 4 + 0x40);
          fVar79 = *pfVar4 - fVar84;
          fVar82 = pfVar4[1] - fVar84;
          fVar83 = pfVar4[2] - fVar84;
          fVar84 = pfVar4[3] - fVar84;
          fVar101 = *pfVar2 - fVar104;
          fVar102 = pfVar2[1] - fVar104;
          fVar103 = pfVar2[2] - fVar104;
          fVar104 = pfVar2[3] - fVar104;
          fVar96 = *(float *)(ray + k * 4 + 0x60);
          fVar126 = fVar92 * fVar101 - fVar79 * fVar96;
          fVar128 = fVar92 * fVar102 - fVar82 * fVar96;
          fVar130 = fVar92 * fVar103 - fVar83 * fVar96;
          fVar132 = fVar92 * fVar104 - fVar84 * fVar96;
          local_1098[0] = fVar99 * fVar124 - fVar78 * fVar46;
          local_1098[1] = fVar100 * fVar125 - fVar113 * fVar48;
          local_1098[2] = fVar74 * fVar33 - fVar114 * fVar58;
          local_1098[3] = fVar76 * fVar44 - fVar115 * fVar66;
          fVar91 = *(float *)(ray + k * 4 + 0x10);
          fVar85 = *pfVar1 - fVar91;
          fVar89 = pfVar1[1] - fVar91;
          fVar90 = pfVar1[2] - fVar91;
          fVar91 = pfVar1[3] - fVar91;
          fVar106 = *(float *)(ray + k * 4 + 0x50);
          fVar105 = fVar96 * fVar85 - fVar106 * fVar101;
          fVar107 = fVar96 * fVar89 - fVar106 * fVar102;
          fVar109 = fVar96 * fVar90 - fVar106 * fVar103;
          fVar111 = fVar96 * fVar91 - fVar106 * fVar104;
          local_11f8 = CONCAT44(fVar70,fVar68);
          fVar133 = fVar106 * fVar79 - fVar92 * fVar85;
          fVar134 = fVar106 * fVar82 - fVar92 * fVar89;
          fVar135 = fVar106 * fVar83 - fVar92 * fVar90;
          fVar136 = fVar106 * fVar84 - fVar92 * fVar91;
          fVar116 = fVar96 * local_1098[0] + local_10a8._0_4_ * fVar106 + fVar68 * fVar92;
          fVar118 = fVar96 * local_1098[1] + local_10a8._4_4_ * fVar106 + fVar70 * fVar92;
          fVar120 = fVar96 * local_1098[2] + local_10a8._8_4_ * fVar106 + fVar75 * fVar92;
          fVar122 = fVar96 * local_1098[3] + local_10a8._12_4_ * fVar106 + fVar77 * fVar92;
          uVar45 = (uint)fVar116 & 0x80000000;
          uVar47 = (uint)fVar118 & 0x80000000;
          uVar49 = (uint)fVar120 & 0x80000000;
          uVar59 = (uint)fVar122 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)(fVar124 * fVar105 + fVar78 * fVar126 + fVar108 * fVar133) ^ uVar45;
          tNear.field_0.i[1] =
               (uint)(fVar125 * fVar107 + fVar113 * fVar128 + fVar110 * fVar134) ^ uVar47;
          tNear.field_0.i[2] =
               (uint)(fVar33 * fVar109 + fVar114 * fVar130 + fVar112 * fVar135) ^ uVar49;
          tNear.field_0.i[3] =
               (uint)(fVar44 * fVar111 + fVar115 * fVar132 + fVar98 * fVar136) ^ uVar59;
          fVar106 = (float)((uint)(fVar105 * fVar46 + fVar126 * fVar99 + fVar133 * fVar117) ^ uVar45
                           );
          fVar108 = (float)((uint)(fVar107 * fVar48 + fVar128 * fVar100 + fVar134 * fVar119) ^
                           uVar47);
          fVar110 = (float)((uint)(fVar109 * fVar58 + fVar130 * fVar74 + fVar135 * fVar121) ^ uVar49
                           );
          fVar112 = (float)((uint)(fVar111 * fVar66 + fVar132 * fVar76 + fVar136 * fVar123) ^ uVar59
                           );
          fVar92 = ABS(fVar116);
          fVar96 = ABS(fVar118);
          auVar95._0_8_ = CONCAT44(fVar118,fVar116) & 0x7fffffff7fffffff;
          auVar95._8_4_ = ABS(fVar120);
          auVar95._12_4_ = ABS(fVar122);
          bVar14 = tNear.field_0.v[0] + fVar106 <= fVar92 &&
                   ((0.0 <= fVar106 && 0.0 <= tNear.field_0.v[0]) && fVar116 != 0.0);
          auVar97._0_4_ = -(uint)bVar14;
          bVar15 = tNear.field_0.v[1] + fVar108 <= fVar96 &&
                   ((0.0 <= fVar108 && 0.0 <= tNear.field_0.v[1]) && fVar118 != 0.0);
          auVar97._4_4_ = -(uint)bVar15;
          bVar13 = tNear.field_0.v[2] + fVar110 <= auVar95._8_4_ &&
                   ((0.0 <= fVar110 && 0.0 <= tNear.field_0.v[2]) && fVar120 != 0.0);
          auVar97._8_4_ = -(uint)bVar13;
          bVar12 = tNear.field_0.v[3] + fVar112 <= auVar95._12_4_ &&
                   ((0.0 <= fVar112 && 0.0 <= tNear.field_0.v[3]) && fVar122 != 0.0);
          auVar97._12_4_ = -(uint)bVar12;
          uVar34 = movmskps((int)pRVar20,auVar97);
          pRVar20 = (RayQueryContext *)(ulong)uVar34;
          if (uVar34 != 0) {
            fVar98 = (float)(uVar45 ^ (uint)(fVar79 * fVar68 +
                                            fVar85 * local_10a8._0_4_ + fVar101 * local_1098[0]));
            fVar99 = (float)(uVar47 ^ (uint)(fVar82 * fVar70 +
                                            fVar89 * local_10a8._4_4_ + fVar102 * local_1098[1]));
            fVar100 = (float)(uVar49 ^ (uint)(fVar83 * fVar75 +
                                             fVar90 * local_10a8._8_4_ + fVar103 * local_1098[2]));
            fVar91 = (float)(uVar59 ^ (uint)(fVar84 * fVar77 +
                                            fVar91 * local_10a8._12_4_ + fVar104 * local_1098[3]));
            fVar84 = *(float *)(ray + k * 4 + 0x30);
            fVar104 = *(float *)(ray + k * 4 + 0x80);
            valid.field_0.i[0] =
                 -(uint)((fVar98 <= fVar104 * fVar92 && fVar84 * fVar92 < fVar98) && bVar14);
            valid.field_0.i[1] =
                 -(uint)((fVar99 <= fVar104 * fVar96 && fVar84 * fVar96 < fVar99) && bVar15);
            valid.field_0.i[2] =
                 -(uint)((fVar100 <= fVar104 * auVar95._8_4_ && fVar84 * auVar95._8_4_ < fVar100) &&
                        bVar13);
            valid.field_0.i[3] =
                 -(uint)((fVar91 <= fVar104 * auVar95._12_4_ && fVar84 * auVar95._12_4_ < fVar91) &&
                        bVar12);
            uVar34 = movmskps(uVar34,(undefined1  [16])valid.field_0);
            pRVar20 = (RayQueryContext *)(ulong)uVar34;
            if (uVar34 != 0) {
              local_10b8 = local_11f8;
              uStack_10b0 = CONCAT44(fVar77,fVar75);
              pSVar7 = context->scene;
              auVar61 = rcpps(local_10a8,auVar95);
              fVar84 = auVar61._0_4_;
              fVar74 = auVar61._4_4_;
              fVar76 = auVar61._8_4_;
              fVar78 = auVar61._12_4_;
              fVar84 = (1.0 - fVar92 * fVar84) * fVar84 + fVar84;
              fVar74 = (1.0 - fVar96 * fVar74) * fVar74 + fVar74;
              fVar76 = (1.0 - auVar95._8_4_ * fVar76) * fVar76 + fVar76;
              fVar78 = (1.0 - auVar95._12_4_ * fVar78) * fVar78 + fVar78;
              fVar98 = fVar98 * fVar84;
              fVar99 = fVar99 * fVar74;
              fVar100 = fVar100 * fVar76;
              fVar91 = fVar91 * fVar78;
              local_10c8[0] = fVar98;
              local_10c8[1] = fVar99;
              local_10c8[2] = fVar100;
              local_10c8[3] = fVar91;
              local_10e8[0] = tNear.field_0.v[0] * fVar84;
              local_10e8[1] = tNear.field_0.v[1] * fVar74;
              local_10e8[2] = tNear.field_0.v[2] * fVar76;
              local_10e8[3] = tNear.field_0.v[3] * fVar78;
              local_10d8[0] = fVar84 * fVar106;
              local_10d8[1] = fVar74 * fVar108;
              local_10d8[2] = fVar76 * fVar110;
              local_10d8[3] = fVar78 * fVar112;
              auVar10._4_4_ = fVar99;
              auVar10._0_4_ = fVar98;
              auVar10._8_4_ = fVar100;
              auVar10._12_4_ = fVar91;
              auVar62 = blendvps(_DAT_01f7a9f0,auVar10,(undefined1  [16])valid.field_0);
              auVar72._4_4_ = auVar62._0_4_;
              auVar72._0_4_ = auVar62._4_4_;
              auVar72._8_4_ = auVar62._12_4_;
              auVar72._12_4_ = auVar62._8_4_;
              auVar61 = minps(auVar72,auVar62);
              auVar51._0_8_ = auVar61._8_8_;
              auVar51._8_4_ = auVar61._0_4_;
              auVar51._12_4_ = auVar61._4_4_;
              auVar61 = minps(auVar51,auVar61);
              uVar34 = -(uint)(auVar61._0_4_ == auVar62._0_4_);
              uVar45 = -(uint)(auVar61._4_4_ == auVar62._4_4_);
              uVar47 = -(uint)(auVar61._8_4_ == auVar62._8_4_);
              uVar49 = -(uint)(auVar61._12_4_ == auVar62._12_4_);
              auVar65._4_4_ = uVar45;
              auVar65._0_4_ = uVar34;
              auVar63._0_4_ = uVar34 & valid.field_0.i[0];
              auVar63._4_4_ = uVar45 & valid.field_0.i[1];
              auVar63._8_4_ = uVar47 & valid.field_0.i[2];
              auVar63._12_4_ = uVar49 & valid.field_0.i[3];
              iVar16 = movmskps((int)pSVar7,auVar63);
              auVar64._8_4_ = 0xffffffff;
              auVar64._0_8_ = 0xffffffffffffffff;
              auVar64._12_4_ = 0xffffffff;
              if (iVar16 != 0) {
                auVar65._8_4_ = uVar47;
                auVar65._12_4_ = uVar49;
                auVar64 = auVar65;
              }
              lVar31 = lVar31 + uVar30;
              auVar41._0_4_ = valid.field_0.i[0] & auVar64._0_4_;
              auVar41._4_4_ = valid.field_0.i[1] & auVar64._4_4_;
              auVar41._8_4_ = valid.field_0.i[2] & auVar64._8_4_;
              auVar41._12_4_ = valid.field_0.i[3] & auVar64._12_4_;
              uVar17 = movmskps(iVar16,auVar41);
              uVar21 = CONCAT44((int)((ulong)pSVar7 >> 0x20),uVar17);
              lVar24 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
LAB_0024a7c6:
              uVar34 = *(uint *)(lVar31 + 0x90 + lVar24 * 4);
              pGVar8 = (pSVar7->geometries).items[uVar34].ptr;
              root.ptr = (size_t)*(uint *)(ray + k * 4 + 0x90);
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[lVar24] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar84 = local_10e8[lVar24];
                  fVar104 = local_10d8[lVar24];
                  *(float *)(ray + k * 4 + 0x80) = local_10c8[lVar24];
                  *(undefined4 *)(ray + k * 4 + 0xc0) =
                       *(undefined4 *)((long)&local_10b8 + lVar24 * 4);
                  *(float *)(ray + k * 4 + 0xd0) = local_1098[lVar24 + -4];
                  *(float *)(ray + k * 4 + 0xe0) = local_1098[lVar24];
                  *(float *)(ray + k * 4 + 0xf0) = fVar84;
                  *(float *)(ray + k * 4 + 0x100) = fVar104;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar31 + 0xa0 + lVar24 * 4)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar34;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  uVar34 = context->user->instPrimID[0];
                  pRVar20 = (RayQueryContext *)(ulong)uVar34;
                  *(uint *)(ray + k * 4 + 0x140) = uVar34;
                  root.ptr = (size_t)context;
                  goto LAB_0024a67b;
                }
                local_1088 = fVar98;
                fStack_1084 = fVar99;
                fStack_1080 = fVar100;
                fStack_107c = fVar91;
                h.u.field_0.v[0] = local_10e8[lVar24];
                h.v.field_0.v[0] = local_10d8[lVar24];
                uVar17 = *(undefined4 *)((long)&local_10b8 + lVar24 * 4);
                fVar84 = local_1098[lVar24 + -4];
                root.ptr = (size_t)context->user;
                h.geomID.field_0.i[1] = uVar34;
                h.geomID.field_0.i[0] = uVar34;
                h.geomID.field_0.i[2] = uVar34;
                h.geomID.field_0.i[3] = uVar34;
                h.primID.field_0.i[0] = *(uint *)(lVar31 + 0xa0 + lVar24 * 4);
                h.Ng.field_0._4_4_ = uVar17;
                h.Ng.field_0._0_4_ = uVar17;
                h.Ng.field_0._8_4_ = uVar17;
                h.Ng.field_0._12_4_ = uVar17;
                h.Ng.field_0._20_4_ = (int)fVar84;
                h.Ng.field_0._16_4_ = (int)fVar84;
                h.Ng.field_0._24_4_ = (int)fVar84;
                h.Ng.field_0._28_4_ = (int)fVar84;
                fVar84 = local_1098[lVar24];
                h.Ng.field_0._36_4_ = (int)fVar84;
                h.Ng.field_0._32_4_ = (int)fVar84;
                h.Ng.field_0._40_4_ = (int)fVar84;
                h.Ng.field_0._44_4_ = (int)fVar84;
                h.u.field_0.v[1] = h.u.field_0.v[0];
                h.u.field_0.v[2] = h.u.field_0.v[0];
                h.u.field_0.v[3] = h.u.field_0.v[0];
                h.v.field_0.v[1] = h.v.field_0.v[0];
                h.v.field_0.v[2] = h.v.field_0.v[0];
                h.v.field_0.v[3] = h.v.field_0.v[0];
                h.primID.field_0.i[1] = h.primID.field_0.i[0];
                h.primID.field_0.i[2] = h.primID.field_0.i[0];
                h.primID.field_0.i[3] = h.primID.field_0.i[0];
                h.instID[0].field_0.i[0] =
                     (uint)((NodeRefPtr<4> *)&((RayQueryContext *)root.ptr)->scene)->ptr;
                h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[0] =
                     *(uint *)((long)&((NodeRefPtr<4> *)&((RayQueryContext *)root.ptr)->scene)->ptr
                              + 4);
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                *(float *)(ray + k * 4 + 0x80) = local_10c8[lVar24];
                local_11a8 = *local_1180;
                args.valid = (int *)local_11a8;
                args.geometryUserPtr = pGVar8->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&h;
                args.N = 4;
                local_1198 = lVar31;
                local_1190 = lVar28;
                local_1188 = lVar26;
                args.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar8->intersectionFilterN)(&args);
                  root.ptr = (size_t)extraout_RDX;
                }
                if (local_11a8 == (undefined1  [16])0x0) {
                  auVar52._8_4_ = 0xffffffff;
                  auVar52._0_8_ = 0xffffffffffffffff;
                  auVar52._12_4_ = 0xffffffff;
                  auVar52 = auVar52 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var9)(&args);
                    root.ptr = (size_t)extraout_RDX_00;
                  }
                  auVar42._0_4_ = -(uint)(local_11a8._0_4_ == 0);
                  auVar42._4_4_ = -(uint)(local_11a8._4_4_ == 0);
                  auVar42._8_4_ = -(uint)(local_11a8._8_4_ == 0);
                  auVar42._12_4_ = -(uint)(local_11a8._12_4_ == 0);
                  auVar52 = auVar42 ^ _DAT_01f7ae20;
                  if (local_11a8 != (undefined1  [16])0x0) {
                    auVar61 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar42);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar42);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar42);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar42);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar42);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar42);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar42);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar42);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar61;
                    auVar61 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar42);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar61;
                  }
                }
                if ((_DAT_01f7bb20 & auVar52) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar104;
                }
                else {
                  fVar104 = *(float *)(ray + k * 4 + 0x80);
                }
                valid.field_0.v[lVar24] = 0.0;
                valid.field_0.i[0] = -(uint)(local_1088 <= fVar104) & valid.field_0.i[0];
                valid.field_0.i[1] = -(uint)(fStack_1084 <= fVar104) & valid.field_0.i[1];
                valid.field_0.i[2] = -(uint)(fStack_1080 <= fVar104) & valid.field_0.i[2];
                valid.field_0.i[3] = -(uint)(fStack_107c <= fVar104) & valid.field_0.i[3];
                lVar26 = local_1188;
                lVar28 = local_1190;
                lVar31 = local_1198;
                fVar98 = local_1088;
                fVar99 = fStack_1084;
                fVar100 = fStack_1080;
                fVar91 = fStack_107c;
              }
              uVar17 = (undefined4)((ulong)lVar24 >> 0x20);
              iVar16 = movmskps((int)lVar24,(undefined1  [16])valid.field_0);
              pRVar20 = (RayQueryContext *)CONCAT44(uVar17,iVar16);
              if (iVar16 == 0) goto LAB_0024a67b;
              auVar11._4_4_ = fVar99;
              auVar11._0_4_ = fVar98;
              auVar11._8_4_ = fVar100;
              auVar11._12_4_ = fVar91;
              auVar62 = blendvps(_DAT_01f7a9f0,auVar11,(undefined1  [16])valid.field_0);
              auVar73._4_4_ = auVar62._0_4_;
              auVar73._0_4_ = auVar62._4_4_;
              auVar73._8_4_ = auVar62._12_4_;
              auVar73._12_4_ = auVar62._8_4_;
              auVar61 = minps(auVar73,auVar62);
              auVar53._0_8_ = auVar61._8_8_;
              auVar53._8_4_ = auVar61._0_4_;
              auVar53._12_4_ = auVar61._4_4_;
              auVar61 = minps(auVar53,auVar61);
              auVar54._0_8_ =
                   CONCAT44(-(uint)(auVar61._4_4_ == auVar62._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar61._0_4_ == auVar62._0_4_) & valid.field_0._0_4_);
              auVar54._8_4_ = -(uint)(auVar61._8_4_ == auVar62._8_4_) & valid.field_0._8_4_;
              auVar54._12_4_ = -(uint)(auVar61._12_4_ == auVar62._12_4_) & valid.field_0._12_4_;
              iVar16 = movmskps(iVar16,auVar54);
              aVar43 = valid.field_0;
              if (iVar16 != 0) {
                aVar43.i[2] = auVar54._8_4_;
                aVar43._0_8_ = auVar54._0_8_;
                aVar43.i[3] = auVar54._12_4_;
              }
              uVar18 = movmskps(iVar16,(undefined1  [16])aVar43);
              uVar21 = CONCAT44(uVar17,uVar18);
              lVar24 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
              goto LAB_0024a7c6;
            }
          }
LAB_0024a67b:
          lVar28 = lVar28 + 1;
        } while (lVar28 != lVar26);
      }
      iVar50 = *(int *)(ray + k * 4 + 0x80);
      fVar108 = local_1018;
      fVar110 = fStack_1014;
      fVar112 = fStack_1010;
      fVar84 = fStack_100c;
      fVar98 = local_1028;
      fVar99 = fStack_1024;
      fVar100 = fStack_1020;
      fVar104 = fStack_101c;
      fVar74 = local_1038;
      fVar76 = fStack_1034;
      fVar78 = fStack_1030;
      fVar92 = fStack_102c;
      fVar113 = local_1048;
      fVar114 = fStack_1044;
      fVar115 = fStack_1040;
      fVar96 = fStack_103c;
      fVar117 = local_1058;
      fVar119 = fStack_1054;
      fVar121 = fStack_1050;
      fVar91 = fStack_104c;
      fVar123 = local_1068;
      fVar124 = fStack_1064;
      fVar125 = fStack_1060;
      fVar106 = fStack_105c;
      iVar127 = local_1078;
      iVar129 = iStack_1074;
      iVar131 = iStack_1070;
      iVar16 = iStack_106c;
      iVar55 = iVar50;
      iVar56 = iVar50;
      iVar57 = iVar50;
    }
    if (pRVar19 == (RayQueryContext *)stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }